

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O3

void __thiscall FlickerRemover::clear(FlickerRemover *this)

{
  uint uVar1;
  UMat **ppUVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  UMat *pUVar6;
  
  uVar3 = (this->corresponding_frames_similarity_levels).count_of_elements;
  if (uVar3 != 0) {
    ppUVar2 = (this->corresponding_frames_similarity_levels).data;
    uVar5 = (this->corresponding_frames_similarity_levels).first_element_index;
    uVar4 = (ulong)uVar5;
    pUVar6 = ppUVar2[uVar4];
    ppUVar2[uVar4] = (UMat *)0x0;
    uVar1 = (this->corresponding_frames_similarity_levels).count_of_slots;
    while( true ) {
      uVar5 = uVar5 + 1;
      if ((int)uVar4 == uVar1 - 1) {
        uVar5 = 0;
      }
      (this->corresponding_frames_similarity_levels).first_element_index = uVar5;
      (this->corresponding_frames_similarity_levels).count_of_elements = uVar3 - 1;
      if (pUVar6 == (UMat *)0x0) break;
      cv::UMat::~UMat(pUVar6);
      operator_delete(pUVar6,0x50);
      uVar3 = (this->corresponding_frames_similarity_levels).count_of_elements;
      if (uVar3 == 0) break;
      ppUVar2 = (this->corresponding_frames_similarity_levels).data;
      uVar5 = (this->corresponding_frames_similarity_levels).first_element_index;
      uVar4 = (ulong)uVar5;
      pUVar6 = ppUVar2[uVar4];
      ppUVar2[uVar4] = (UMat *)0x0;
      uVar1 = (this->corresponding_frames_similarity_levels).count_of_slots;
    }
  }
  uVar3 = (this->adjacent_frames_similarity_levels).count_of_elements;
  if (uVar3 != 0) {
    ppUVar2 = (this->adjacent_frames_similarity_levels).data;
    uVar5 = (this->adjacent_frames_similarity_levels).first_element_index;
    uVar4 = (ulong)uVar5;
    pUVar6 = ppUVar2[uVar4];
    ppUVar2[uVar4] = (UMat *)0x0;
    uVar1 = (this->adjacent_frames_similarity_levels).count_of_slots;
    while( true ) {
      uVar5 = uVar5 + 1;
      if ((int)uVar4 == uVar1 - 1) {
        uVar5 = 0;
      }
      (this->adjacent_frames_similarity_levels).first_element_index = uVar5;
      (this->adjacent_frames_similarity_levels).count_of_elements = uVar3 - 1;
      if (pUVar6 == (UMat *)0x0) break;
      cv::UMat::~UMat(pUVar6);
      operator_delete(pUVar6,0x50);
      uVar3 = (this->adjacent_frames_similarity_levels).count_of_elements;
      if (uVar3 == 0) {
        return;
      }
      ppUVar2 = (this->adjacent_frames_similarity_levels).data;
      uVar5 = (this->adjacent_frames_similarity_levels).first_element_index;
      uVar4 = (ulong)uVar5;
      pUVar6 = ppUVar2[uVar4];
      ppUVar2[uVar4] = (UMat *)0x0;
      uVar1 = (this->adjacent_frames_similarity_levels).count_of_slots;
    }
  }
  return;
}

Assistant:

void FlickerRemover::clear() {
    auto to_delete_1 = corresponding_frames_similarity_levels.pop();
    while(to_delete_1 != nullptr) {
        delete to_delete_1;
        to_delete_1 = corresponding_frames_similarity_levels.pop();
    }
    auto to_delete_2 = adjacent_frames_similarity_levels.pop();
    while(to_delete_2 != nullptr) {
        delete to_delete_2;
        to_delete_2 = adjacent_frames_similarity_levels.pop();
    }
}